

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void ON_RenderContentPrivate::SetModel(ON_RenderContent *rc,ONX_Model *model)

{
  ON_RenderContent *rc_00;
  ON_RenderContent *child_rc;
  ChildIterator it;
  ONX_Model *model_local;
  ON_RenderContent *rc_local;
  
  rc->_private->m_model = model;
  it._private = (ON_RenderContentChildIteratorPrivate *)model;
  (*(rc->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2f])(&child_rc);
  while( true ) {
    rc_00 = ON_RenderContent::ChildIterator::GetNextChild((ChildIterator *)&child_rc);
    if (rc_00 == (ON_RenderContent *)0x0) break;
    SetModel(rc_00,(ONX_Model *)it._private);
  }
  ON_RenderContent::ChildIterator::~ChildIterator((ChildIterator *)&child_rc);
  return;
}

Assistant:

void ON_RenderContentPrivate::SetModel(const ON_RenderContent& rc, ONX_Model& model) // Static.
{
  rc._private->m_model = &model;

  auto it = rc.GetChildIterator();
  ON_RenderContent* child_rc = nullptr;
  while (nullptr != (child_rc = it.GetNextChild()))
  {
    SetModel(*child_rc, model);
  }
}